

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

ByteArray *
ot::commissioner::CommissionerApp::GetSteeringData
          (CommissionerDataset *aDataset,JoinerType aJoinerType)

{
  JoinerType aJoinerType_local;
  CommissionerDataset *aDataset_local;
  
  if (aJoinerType == kMeshCoP) {
    aDataset->mPresentFlags = aDataset->mPresentFlags | 0x2000;
    aDataset_local = (CommissionerDataset *)&aDataset->mSteeringData;
  }
  else if (aJoinerType == kAE) {
    aDataset->mPresentFlags = aDataset->mPresentFlags | 0x1000;
    aDataset_local = (CommissionerDataset *)&aDataset->mAeSteeringData;
  }
  else {
    if (aJoinerType != kNMKP) {
      abort();
    }
    aDataset->mPresentFlags = aDataset->mPresentFlags | 0x800;
    aDataset_local = (CommissionerDataset *)&aDataset->mNmkpSteeringData;
  }
  return (ByteArray *)aDataset_local;
}

Assistant:

ByteArray &CommissionerApp::GetSteeringData(CommissionerDataset &aDataset, JoinerType aJoinerType)
{
    switch (aJoinerType)
    {
    case JoinerType::kMeshCoP:
        aDataset.mPresentFlags |= CommissionerDataset::kSteeringDataBit;
        return aDataset.mSteeringData;

    case JoinerType::kAE:
        aDataset.mPresentFlags |= CommissionerDataset::kAeSteeringDataBit;
        return aDataset.mAeSteeringData;

    case JoinerType::kNMKP:
        aDataset.mPresentFlags |= CommissionerDataset::kNmkpSteeringDataBit;
        return aDataset.mNmkpSteeringData;

    default:
        VerifyOrDie(false);
        aDataset.mPresentFlags |= CommissionerDataset::kSteeringDataBit;
        return aDataset.mSteeringData;
    }
}